

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_latlink_t * ps_lattice_popq(ps_lattice_t *dag)

{
  latlink_list_t *elem;
  latlink_list_s *plVar1;
  ps_latlink_t *ppVar2;
  
  elem = dag->q_head;
  if (elem == (latlink_list_t *)0x0) {
    ppVar2 = (ps_latlink_t *)0x0;
  }
  else {
    ppVar2 = elem->link;
    plVar1 = elem->next;
    __listelem_free__(dag->latlink_list_alloc,elem,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x434);
    dag->q_head = plVar1;
    if (plVar1 == (latlink_list_s *)0x0) {
      dag->q_tail = (latlink_list_t *)0x0;
    }
  }
  return ppVar2;
}

Assistant:

ps_latlink_t *
ps_lattice_popq(ps_lattice_t *dag)
{
    latlink_list_t *x;
    ps_latlink_t *link;

    if (dag->q_head == NULL)
        return NULL;
    link = dag->q_head->link;
    x = dag->q_head->next;
    listelem_free(dag->latlink_list_alloc, dag->q_head);
    dag->q_head = x;
    if (dag->q_head == NULL)
        dag->q_tail = NULL;
    return link;
}